

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::operator==(ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  double *local_38;
  double *y;
  double *x16;
  double *x;
  ON_Xform *rhs_local;
  ON_Xform *this_local;
  
  local_38 = (double *)rhs;
  x16 = (double *)this;
  do {
    if (this + 1 <= x16) {
      return true;
    }
    dVar1 = *x16;
    dVar2 = *local_38;
  } while ((dVar1 == *local_38) &&
          (local_38 = local_38 + 1, x16 = x16 + 1, !NAN(dVar1) && !NAN(dVar2)));
  return false;
}

Assistant:

bool ON_Xform::operator==(const ON_Xform& rhs) const
{
  // Intentionally returns false if any coefficient is a nan.
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  const double* y = &rhs.m_xform[0][0];
  while (x < x16)
  {
    if (*x++ == *y++)
      continue;
    return false; // not equal or a nan
  }
  return true;
}